

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O3

blargg_err_t __thiscall Gme_File::track_info(Gme_File *this,track_info_t *out,int track)

{
  entry_t *peVar1;
  int iVar2;
  blargg_err_t pcVar3;
  undefined4 extraout_var;
  int remapped;
  uint local_34;
  
  out->track_count = (long)this->track_count_;
  *(undefined4 *)&out->length = 0xffffffff;
  *(undefined4 *)((long)&out->length + 4) = 0xffffffff;
  *(undefined4 *)&out->intro_length = 0xffffffff;
  *(undefined4 *)((long)&out->intro_length + 4) = 0xffffffff;
  out->loop_length = -1;
  out->song[0] = '\0';
  out->game[0] = '\0';
  out->author[0] = '\0';
  out->copyright[0] = '\0';
  out->comment[0] = '\0';
  out->dumper[0] = '\0';
  out->system[0] = '\0';
  copy_field_(out->system,this->type_->system,0xff);
  local_34 = track;
  pcVar3 = remap_track_(this,(int *)&local_34);
  if (pcVar3 == (blargg_err_t)0x0) {
    iVar2 = (*this->_vptr_Gme_File[5])(this,out,(ulong)local_34);
    pcVar3 = (blargg_err_t)CONCAT44(extraout_var,iVar2);
    if (pcVar3 == (blargg_err_t)0x0) {
      if ((int)(this->playlist).entries.size_ != 0) {
        copy_field_(out->game,(this->playlist).info_.title,0xff);
        copy_field_(out->author,(this->playlist).info_.engineer,0xff);
        copy_field_(out->author,(this->playlist).info_.composer,0xff);
        copy_field_(out->dumper,(this->playlist).info_.ripping,0xff);
        peVar1 = (this->playlist).entries.begin_;
        copy_field_(out->song,peVar1[track].name,0xff);
        if (-1 < (long)peVar1[track].length) {
          out->length = (long)peVar1[track].length * 1000;
        }
        if (-1 < (long)peVar1[track].intro) {
          out->intro_length = (long)peVar1[track].intro * 1000;
        }
        if (-1 < (long)peVar1[track].loop) {
          out->loop_length = (long)peVar1[track].loop * 1000;
        }
      }
      pcVar3 = (blargg_err_t)0x0;
    }
  }
  return pcVar3;
}

Assistant:

blargg_err_t Gme_File::track_info( track_info_t* out, int track ) const
{
	out->track_count = track_count();
	out->length        = -1;
	out->loop_length   = -1;
	out->intro_length  = -1;
	out->song [0]      = 0;
	
	out->game [0]      = 0;
	out->author [0]    = 0;
	out->copyright [0] = 0;
	out->comment [0]   = 0;
	out->dumper [0]    = 0;
	out->system [0]    = 0;
	
	copy_field_( out->system, type()->system );
	
	int remapped = track;
	RETURN_ERR( remap_track_( &remapped ) );
	RETURN_ERR( track_info_( out, remapped ) );
	
	// override with m3u info
	if ( playlist.size() )
	{
		M3u_Playlist::info_t const& i = playlist.info();
		copy_field_( out->game  , i.title );
		copy_field_( out->author, i.engineer );
		copy_field_( out->author, i.composer );
		copy_field_( out->dumper, i.ripping );
		
		M3u_Playlist::entry_t const& e = playlist [track];
		copy_field_( out->song, e.name );
		if ( e.length >= 0 ) out->length       = e.length * 1000L;
		if ( e.intro  >= 0 ) out->intro_length = e.intro  * 1000L;
		if ( e.loop   >= 0 ) out->loop_length  = e.loop   * 1000L;
	}
	return 0;
}